

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O0

void __thiscall PFData_test_setIndexOrder_Test::TestBody(PFData_test_setIndexOrder_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  Type type;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  PFData test_read;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  double data [24];
  PFData test;
  PFData *in_stack_fffffffffffff7e8;
  undefined7 in_stack_fffffffffffff7f0;
  undefined1 in_stack_fffffffffffff7f7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f8;
  undefined7 in_stack_fffffffffffff800;
  undefined1 in_stack_fffffffffffff807;
  char *in_stack_fffffffffffff808;
  allocator *lhs_expression;
  char *in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff818;
  undefined4 uVar4;
  Type in_stack_fffffffffffff81c;
  PFData *in_stack_fffffffffffff820;
  PFData *this_00;
  string *in_stack_fffffffffffff828;
  undefined7 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff837;
  string *in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff864;
  Message *in_stack_fffffffffffff868;
  allocator *message;
  AssertHelper *in_stack_fffffffffffff870;
  undefined7 in_stack_fffffffffffff8a8;
  PFData *this_01;
  AssertionResult local_6d8;
  undefined1 local_6c0 [8];
  string local_6b8 [32];
  AssertionResult local_698;
  allocator local_681;
  string local_680 [32];
  PFData local_660;
  undefined4 local_5a8;
  undefined1 local_5a1 [37];
  Type local_57c;
  AssertionResult local_578 [2];
  string local_558 [32];
  AssertionResult local_538;
  allocator local_521;
  string local_520 [48];
  string local_4f0 [32];
  AssertionResult local_4d0;
  allocator local_4b9;
  string local_4b8 [36];
  uint local_494;
  undefined4 local_480;
  allocator local_479;
  string local_478 [36];
  int local_454;
  AssertionResult local_450 [2];
  string local_430 [32];
  AssertionResult local_410;
  allocator local_3f9;
  string local_3f8 [48];
  string local_3c8 [32];
  AssertionResult local_3a8;
  allocator local_391;
  string local_390 [48];
  string local_360 [32];
  AssertionResult local_340;
  allocator local_329;
  string local_328 [48];
  string local_2f8 [32];
  AssertionResult local_2d8;
  undefined1 local_2c1 [49];
  string local_290 [32];
  AssertionResult local_270;
  allocator local_259;
  string local_258 [48];
  string local_228 [32];
  AssertionResult local_208;
  allocator local_1f1;
  string local_1f0 [48];
  string local_1c0 [32];
  AssertionResult local_1a0 [2];
  int local_17c;
  double local_178 [25];
  PFData local_b0;
  
  memset(&local_b0,0,0xa8);
  PFData::PFData(in_stack_fffffffffffff820);
  for (local_17c = 0; local_17c < 0x18; local_17c = local_17c + 1) {
    iVar3 = rand();
    local_178[local_17c] = (double)iVar3 / 1000.0;
  }
  PFData::setData(&local_b0,local_178);
  PFData::getIndexOrder_abi_cxx11_(in_stack_fffffffffffff7e8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            (in_stack_fffffffffffff808,
             (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
             in_stack_fffffffffffff7f8,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  std::__cxx11::string::~string(local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff820);
    testing::AssertionResult::failure_message((AssertionResult *)0x128d61);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
               in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x128dc4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128e1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"xyz",&local_1f1);
  PFData::setIndexOrder
            ((PFData *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  PFData::getIndexOrder_abi_cxx11_(in_stack_fffffffffffff7e8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            (in_stack_fffffffffffff808,
             (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
             in_stack_fffffffffffff7f8,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  std::__cxx11::string::~string(local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff820);
    testing::AssertionResult::failure_message((AssertionResult *)0x128fb1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
               in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x129014);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12906c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"xYz",&local_259);
  PFData::setIndexOrder
            ((PFData *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  PFData::getIndexOrder_abi_cxx11_(in_stack_fffffffffffff7e8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            (in_stack_fffffffffffff808,
             (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
             in_stack_fffffffffffff7f8,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  std::__cxx11::string::~string(local_290);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff820);
    testing::AssertionResult::failure_message((AssertionResult *)0x129201);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
               in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x129264);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1292bc);
  this_01 = (PFData *)local_2c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_2c1 + 1),"xYZ",(allocator *)this_01);
  PFData::setIndexOrder
            ((PFData *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828);
  std::__cxx11::string::~string((string *)(local_2c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2c1);
  PFData::getIndexOrder_abi_cxx11_(in_stack_fffffffffffff7e8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            (in_stack_fffffffffffff808,
             (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
             in_stack_fffffffffffff7f8,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  std::__cxx11::string::~string(local_2f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff820);
    testing::AssertionResult::failure_message((AssertionResult *)0x129451);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
               in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x1294b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12950c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"XYZ",&local_329);
  PFData::setIndexOrder
            ((PFData *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  PFData::getIndexOrder_abi_cxx11_(in_stack_fffffffffffff7e8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            (in_stack_fffffffffffff808,
             (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
             in_stack_fffffffffffff7f8,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  std::__cxx11::string::~string(local_360);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff820);
    testing::AssertionResult::failure_message((AssertionResult *)0x1296a1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
               in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x129704);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12975c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"XYZZZZ",&local_391);
  PFData::setIndexOrder
            ((PFData *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  PFData::getIndexOrder_abi_cxx11_(in_stack_fffffffffffff7e8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            (in_stack_fffffffffffff808,
             (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
             in_stack_fffffffffffff7f8,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  std::__cxx11::string::~string(local_3c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff820);
    testing::AssertionResult::failure_message((AssertionResult *)0x1298f1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
               in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x129954);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1299ac);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"abc",&local_3f9);
  PFData::setIndexOrder
            ((PFData *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
             in_stack_fffffffffffff828);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  PFData::getIndexOrder_abi_cxx11_(in_stack_fffffffffffff7e8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            (in_stack_fffffffffffff808,
             (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
             in_stack_fffffffffffff7f8,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  std::__cxx11::string::~string(local_430);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_410);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff820);
    in_stack_fffffffffffff870 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x129b41);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
               in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x129ba4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x129bfc);
  message = &local_479;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"tests/test_write_index_order.pfb",message);
  iVar3 = PFData::writeFile((PFData *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                            in_stack_fffffffffffff858);
  local_480 = 1;
  local_454 = iVar3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff808,
             (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
             (int *)in_stack_fffffffffffff7f8,
             (int *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_450);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff860);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff820);
    in_stack_fffffffffffff858 =
         (string *)testing::AssertionResult::failure_message((AssertionResult *)0x129d59);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
               in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    testing::Message::~Message((Message *)0x129db6);
  }
  local_494 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x129e24);
  if (local_494 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b8,"ZYX",&local_4b9);
    PFData::setIndexOrder
              ((PFData *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               in_stack_fffffffffffff828);
    std::__cxx11::string::~string(local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    PFData::getIndexOrder_abi_cxx11_(in_stack_fffffffffffff7e8);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
              (in_stack_fffffffffffff808,
               (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
               in_stack_fffffffffffff7f8,
               (char (*) [4])CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    std::__cxx11::string::~string(local_4f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4d0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff820);
      testing::AssertionResult::failure_message((AssertionResult *)0x129fbe);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
                 in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,(Message *)message);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
      testing::Message::~Message((Message *)0x12a01b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12a073);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_520,"zYx",&local_521);
    PFData::setIndexOrder
              ((PFData *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               in_stack_fffffffffffff828);
    std::__cxx11::string::~string(local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    PFData::getIndexOrder_abi_cxx11_(in_stack_fffffffffffff7e8);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
              (in_stack_fffffffffffff808,
               (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
               in_stack_fffffffffffff7f8,
               (char (*) [4])CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    std::__cxx11::string::~string(local_558);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_538);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff820);
      testing::AssertionResult::failure_message((AssertionResult *)0x12a1fc);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
                 in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,(Message *)message);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
      testing::Message::~Message((Message *)0x12a259);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12a2b1);
    this_00 = (PFData *)local_5a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_5a1 + 1),"tests/test_write_index_order.pfb",(allocator *)this_00);
    type = PFData::writeFile((PFData *)CONCAT44(iVar3,uVar4),in_stack_fffffffffffff858);
    local_5a8 = 0;
    local_57c = type;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff808,
               (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
               (int *)in_stack_fffffffffffff7f8,
               (int *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    iVar3 = (int)((ulong)in_stack_fffffffffffff808 >> 0x20);
    std::__cxx11::string::~string((string *)(local_5a1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_5a1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_578);
    uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff818);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffff810 =
           testing::AssertionResult::failure_message((AssertionResult *)0x12a408);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,type,in_stack_fffffffffffff810,iVar3,
                 (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,(Message *)message);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
      testing::Message::~Message((Message *)0x12a465);
    }
    local_494 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12a4d3);
    if (local_494 == 0) {
      lhs_expression = &local_681;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_680,"tests/test_write_index_order.pfb",lhs_expression);
      PFData::PFData(this_00,(string *)CONCAT44(type,uVar4));
      std::__cxx11::string::~string(local_680);
      std::allocator<char>::~allocator((allocator<char> *)&local_681);
      PFData::loadHeader(this_01);
      PFData::loadData((PFData *)CONCAT17(uVar2,in_stack_fffffffffffff8a8));
      PFData::getIndexOrder_abi_cxx11_(in_stack_fffffffffffff7e8);
      iVar3 = 0x18514c;
      testing::internal::EqHelper::
      Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((char *)lhs_expression,
                 (char *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
                 (char (*) [4])in_stack_fffffffffffff7f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
      std::__cxx11::string::~string(local_6b8);
      uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_698);
      if (!(bool)uVar2) {
        testing::Message::Message((Message *)this_00);
        in_stack_fffffffffffff7f8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x12a6a4);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,type,in_stack_fffffffffffff810,
                   (int)((ulong)lhs_expression >> 0x20),
                   (char *)CONCAT17(uVar2,in_stack_fffffffffffff800));
        iVar3 = (int)local_6c0;
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,(Message *)message);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
        testing::Message::~Message((Message *)0x12a701);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12a759);
      PFData::close(&local_b0,iVar3);
      PFData::close(&local_660,iVar3);
      remove("tests/test_write_index_order.pfb");
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)lhs_expression,(char *)CONCAT17(uVar2,in_stack_fffffffffffff800),
                 (int *)in_stack_fffffffffffff7f8,
                 (int *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
      iVar3 = (int)((ulong)lhs_expression >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6d8);
      in_stack_fffffffffffff7f7 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)this_00);
        testing::AssertionResult::failure_message((AssertionResult *)0x12a82b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,type,in_stack_fffffffffffff810,iVar3,
                   (char *)CONCAT17(uVar2,in_stack_fffffffffffff800));
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffff870,(Message *)message);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
        testing::Message::~Message((Message *)0x12a886);
      }
      local_494 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12a8f1);
      if (local_494 == 0) {
        local_494 = 0;
      }
      PFData::~PFData((PFData *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    }
  }
  PFData::~PFData((PFData *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  return;
}

Assistant:

TEST_F(PFData_test, setIndexOrder) {
    PFData test = PFData();
    double data[24];
    for (int i =0; i<24; i++) {
        data[i] = (double) rand() / 1000;
    }
    test.setData(data);

    // Should equal "zyz"
    EXPECT_EQ(test.getIndexOrder(), "zyx");

    // Should equal "xyz"
    test.setIndexOrder("xyz");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("xYz");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("xYZ");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("XYZ");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("XYZZZZ");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should not work, should still equal "xyz"
    test.setIndexOrder("abc");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should not be able to write to file when indexOrder == "xyz"
    ASSERT_EQ(test.writeFile("tests/test_write_index_order.pfb"), 1);

    // Should equal "zyx"
    test.setIndexOrder("ZYX");
    EXPECT_EQ(test.getIndexOrder(), "zyx");

    // Should equal "zyx"
    test.setIndexOrder("zYx");
    EXPECT_EQ(test.getIndexOrder(), "zyx");

    // Should be able to write to file
    ASSERT_EQ(test.writeFile("tests/test_write_index_order.pfb"), 0);

    // Read file, indexOrder should equal "zyx"
    PFData test_read = PFData("tests/test_write_index_order.pfb");
    test_read.loadHeader();
    test_read.loadData();
    EXPECT_EQ("zyx", test_read.getIndexOrder());

    test.close();
    test_read.close();
    ASSERT_EQ(0, remove("tests/test_write_index_order.pfb"));
}